

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::AvgState<duckdb::hugeint_t>,long,duckdb::DiscreteAverageOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  long *plVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  sel_t *psVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  unsigned_long uVar9;
  long lVar10;
  idx_t iVar11;
  ulong uVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar6 = 0;
      uVar7 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar9 = 0xffffffffffffffff;
        }
        else {
          uVar9 = puVar1[uVar6];
        }
        uVar12 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar12 = count;
        }
        uVar13 = uVar12;
        if (uVar9 != 0) {
          uVar13 = uVar7;
          if (uVar9 == 0xffffffffffffffff) {
            lVar10 = uVar12 - uVar7;
            if (uVar7 <= uVar12 && lVar10 != 0) {
              uVar13 = *(ulong *)(state + 8);
              do {
                uVar4 = *(ulong *)(pdVar3 + uVar7 * 8);
                uVar13 = uVar13 + uVar4;
                if (-1 < (long)uVar4 != uVar4 <= uVar13) {
                  *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar4 >> 0x3f | 1U);
                }
                uVar7 = uVar7 + 1;
              } while (uVar12 != uVar7);
              *(long *)state = lVar10 + *(long *)state;
              *(ulong *)(state + 8) = uVar13;
              uVar13 = uVar7;
            }
          }
          else if (uVar7 < uVar12) {
            uVar13 = 0;
            do {
              if ((uVar9 >> (uVar13 & 0x3f) & 1) != 0) {
                *(long *)state = *(long *)state + 1;
                uVar4 = *(ulong *)(pdVar3 + uVar13 * 8 + uVar7 * 8);
                lVar10 = *(long *)(state + 8);
                *(ulong *)(state + 8) = lVar10 + uVar4;
                if (-1 < (long)uVar4 != uVar4 <= lVar10 + uVar4) {
                  *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar4 >> 0x3f | 1U);
                }
              }
              uVar13 = uVar13 + 1;
            } while ((uVar7 - uVar12) + uVar13 != 0);
            uVar13 = uVar7 + uVar13;
          }
        }
        uVar6 = uVar6 + 1;
        uVar7 = uVar13;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      plVar2 = (long *)input->data;
      *(idx_t *)state = *(long *)state + count;
      AddToHugeint::AddConstant<duckdb::AvgState<duckdb::hugeint_t>,long>
                ((AvgState<duckdb::hugeint_t> *)state,*plVar2,count);
      return;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
    Vector::ToUnifiedFormat(input,count,&local_70);
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_70.sel)->sel_vector;
        uVar7 = *(ulong *)(state + 8);
        iVar8 = 0;
        do {
          iVar11 = iVar8;
          if (psVar5 != (sel_t *)0x0) {
            iVar11 = (idx_t)psVar5[iVar8];
          }
          uVar6 = *(ulong *)(local_70.data + iVar11 * 8);
          uVar7 = uVar7 + uVar6;
          if (-1 < (long)uVar6 != uVar6 <= uVar7) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar6 >> 0x3f | 1U);
          }
          iVar8 = iVar8 + 1;
        } while (count != iVar8);
        *(idx_t *)state = *(long *)state + count;
        *(ulong *)(state + 8) = uVar7;
      }
    }
    else if (count != 0) {
      psVar5 = (local_70.sel)->sel_vector;
      iVar8 = 0;
      do {
        iVar11 = iVar8;
        if (psVar5 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar5[iVar8];
        }
        if ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar11 >> 6]
             >> (iVar11 & 0x3f) & 1) != 0) {
          *(long *)state = *(long *)state + 1;
          uVar7 = *(ulong *)(local_70.data + iVar11 * 8);
          lVar10 = *(long *)(state + 8);
          *(ulong *)(state + 8) = lVar10 + uVar7;
          if (-1 < (long)uVar7 != uVar7 <= lVar10 + uVar7) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar7 >> 0x3f | 1U);
          }
        }
        iVar8 = iVar8 + 1;
      } while (count != iVar8);
    }
    if (local_70.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}